

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPU.cpp
# Opt level: O1

void __thiscall PPU::incrementY(PPU *this)

{
  ushort uVar1;
  
  uVar1 = this->vramCur;
  if ((~uVar1 & 0x7000) == 0) {
    this->vramCur = uVar1 & 0x8fff;
    if ((uVar1 & 0x3e0) == 0x3a0) {
      this->vramCur = uVar1 & 0x8fff ^ 0x800;
      uVar1 = 0;
    }
    else {
      uVar1 = uVar1 + 0x20 & 0x3e0;
    }
    uVar1 = uVar1 | this->vramCur & 0xfc1f;
  }
  else {
    uVar1 = uVar1 + 0x1000;
  }
  this->vramCur = uVar1;
  return;
}

Assistant:

void PPU::incrementY() {
    if ((vramCur & 0x7000) == 0x7000) {
        vramCur &= ~0x7000;
        int y = (vramCur & 0x03E0) >> 5;
        if (y == 29) {
            y = 0;
            vramCur ^= 0x0800;
        } else {
            y = (y + 1) & 31;
        }
        vramCur = (vramCur & ~0x03E0) | (y << 5);
    } else {
        vramCur += 0x1000;
    }
}